

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_simd_2_24_unconditional(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  __m256i row;
  __m256i row_00;
  __m256i row_01;
  __m256i row_02;
  __m256i row_03;
  __m256i row_04;
  __m256i col;
  __m256i col_00;
  __m256i col_01;
  __m256i col_02;
  __m256i col_03;
  __m256i col_04;
  __m256i scale;
  __m256i scale_00;
  __m256i scale_01;
  __m256i scale_02;
  __m256i scale_03;
  __m256i scale_04;
  int i;
  float *pfVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  float *pfVar17;
  uint uVar18;
  float *pfVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  float *pfVar25;
  int iVar26;
  float *pfVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar41 [16];
  float fVar40;
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  float fVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 in_ZMM8 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined8 in_stack_fffffffffffffea8;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  longlong lVar58;
  undefined1 in_stack_fffffffffffffed8 [12];
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  float fVar59;
  undefined4 in_stack_fffffffffffffef0;
  float fVar60;
  undefined4 in_stack_fffffffffffffef4;
  float fVar61;
  undefined4 in_stack_fffffffffffffef8;
  float fVar62;
  undefined4 in_stack_fffffffffffffefc;
  
  auVar34._8_4_ = 0x3effffff;
  auVar34._0_8_ = 0x3effffff3effffff;
  auVar34._12_4_ = 0x3effffff;
  fVar40 = ipoint->scale;
  auVar35._4_4_ = fVar40;
  auVar35._0_4_ = fVar40;
  auVar35._8_4_ = fVar40;
  auVar35._12_4_ = fVar40;
  auVar36._8_4_ = 0x80000000;
  auVar36._0_8_ = 0x8000000080000000;
  auVar36._12_4_ = 0x80000000;
  auVar28 = vpternlogd_avx512vl(auVar34,auVar35,auVar36,0xf8);
  auVar29 = vpternlogd_avx512vl(auVar34,ZEXT416((uint)ipoint->y),auVar36,0xf8);
  auVar28 = ZEXT416((uint)(fVar40 + auVar28._0_4_));
  auVar28 = vroundss_avx(auVar28,auVar28,0xb);
  auVar29 = ZEXT416((uint)(ipoint->y + auVar29._0_4_));
  auVar29 = vroundss_avx(auVar29,auVar29,0xb);
  auVar30._0_8_ = (double)auVar29._0_4_;
  auVar30._8_8_ = auVar29._8_8_;
  auVar39 = vpbroadcastd_avx512vl();
  uVar56 = auVar39._0_4_;
  uVar57 = auVar39._4_4_;
  lVar58 = auVar39._8_8_;
  auVar37 = auVar39._16_16_;
  fVar52 = fVar40 * fVar40;
  auVar29 = vpternlogd_avx512vl(auVar34,ZEXT416((uint)ipoint->x),auVar36,0xf8);
  auVar33._0_8_ = (double)fVar40;
  auVar33._8_8_ = auVar35._8_8_;
  auVar29 = ZEXT416((uint)(ipoint->x + auVar29._0_4_));
  auVar29 = vroundss_avx(auVar29,auVar29,0xb);
  auVar30 = vfmadd231sd_fma(auVar30,auVar33,ZEXT816(0x3fe0000000000000));
  auVar32._0_8_ = (double)auVar29._0_4_;
  auVar32._8_8_ = auVar29._8_8_;
  auVar29 = vfmadd231sd_fma(auVar32,auVar33,ZEXT816(0x3fe0000000000000));
  auVar31._0_4_ = (int)auVar28._0_4_;
  auVar31._4_4_ = (int)auVar28._4_4_;
  auVar31._8_4_ = (int)auVar28._8_4_;
  auVar31._12_4_ = (int)auVar28._12_4_;
  auVar28 = vcvtdq2ps_avx(auVar31);
  fVar3 = (float)auVar29._0_8_ - auVar28._0_4_;
  fVar54 = (float)auVar30._0_8_ - auVar28._0_4_;
  auVar45._0_4_ = fVar40 * kk1_inner_arrays_simd[0] + fVar3;
  auVar45._4_4_ = fVar40 * kk1_inner_arrays_simd[1] + fVar3;
  auVar45._8_4_ = fVar40 * kk1_inner_arrays_simd[2] + fVar3;
  auVar45._12_4_ = fVar40 * kk1_inner_arrays_simd[3] + fVar3;
  auVar45._16_4_ = fVar40 * kk1_inner_arrays_simd[4] + fVar3;
  auVar45._20_4_ = fVar40 * kk1_inner_arrays_simd[5] + fVar3;
  auVar45._24_4_ = fVar40 * kk1_inner_arrays_simd[6] + fVar3;
  auVar45._28_4_ = fVar3 + 0.0;
  auVar39._0_4_ = fVar40 * kk0_inner_arrays_simd[0] + fVar3;
  auVar39._4_4_ = fVar40 * kk0_inner_arrays_simd[1] + fVar3;
  auVar39._8_4_ = fVar40 * kk0_inner_arrays_simd[2] + fVar3;
  auVar39._12_4_ = fVar40 * kk0_inner_arrays_simd[3] + fVar3;
  auVar39._16_4_ = fVar40 * kk0_inner_arrays_simd[4] + fVar3;
  auVar39._20_4_ = fVar40 * kk0_inner_arrays_simd[5] + fVar3;
  auVar39._24_4_ = fVar40 * kk0_inner_arrays_simd[6] + fVar3;
  auVar39._28_4_ = fVar3 + 0.0;
  vcvtps2dq_avx(auVar45);
  vcvtps2dq_avx(auVar39);
  auVar42._0_4_ = fVar40 * kk2_inner_arrays_simd[0] + fVar3;
  auVar42._4_4_ = fVar40 * kk2_inner_arrays_simd[1] + fVar3;
  auVar42._8_4_ = fVar40 * kk2_inner_arrays_simd[2] + fVar3;
  auVar42._12_4_ = fVar40 * kk2_inner_arrays_simd[3] + fVar3;
  auVar42._16_4_ = fVar40 * kk2_inner_arrays_simd[4] + fVar3;
  auVar42._20_4_ = fVar40 * kk2_inner_arrays_simd[5] + fVar3;
  auVar42._24_4_ = fVar40 * kk2_inner_arrays_simd[6] + fVar3;
  auVar42._28_4_ = fVar3 + 0.0;
  vcvtps2dq_avx(auVar42);
  lVar23 = 0x60;
  for (iVar26 = -0xc; iVar26 < 0xc; iVar26 = iVar26 + 4) {
    auVar48._8_4_ = 0x3effffff;
    auVar48._0_8_ = 0x3effffff3effffff;
    auVar48._12_4_ = 0x3effffff;
    auVar47._8_4_ = 0x80000000;
    auVar47._0_8_ = 0x8000000080000000;
    auVar47._12_4_ = 0x80000000;
    auVar38._0_4_ = (float)iVar26;
    auVar38._4_12_ = in_ZMM8._4_12_;
    auVar28 = vfmadd213ss_fma(auVar38,auVar35,ZEXT416((uint)fVar54));
    auVar29 = vpternlogd_avx512vl(auVar48,auVar28,auVar47,0xf8);
    auVar28 = ZEXT416((uint)(auVar28._0_4_ + auVar29._0_4_));
    vroundss_avx(auVar28,auVar28,0xb);
    auVar41._0_4_ = (float)(iVar26 + 1);
    auVar41._4_12_ = in_ZMM8._4_12_;
    auVar28 = vfmadd213ss_fma(auVar41,auVar35,ZEXT416((uint)fVar54));
    auVar29 = vpternlogd_avx512vl(auVar48,auVar28,auVar47,0xf8);
    vpbroadcastd_avx512vl();
    auVar28 = ZEXT416((uint)(auVar28._0_4_ + auVar29._0_4_));
    vroundss_avx(auVar28,auVar28,0xb);
    vpbroadcastd_avx512vl();
    row[1]._0_4_ = fVar52;
    row[0] = in_stack_fffffffffffffea8;
    row[1]._4_4_ = fVar54;
    row[2]._0_4_ = uVar56;
    row[2]._4_4_ = uVar57;
    row[3] = lVar58;
    col._16_12_ = in_stack_fffffffffffffed8;
    col[0] = auVar37._0_8_;
    col[1] = auVar37._8_8_;
    col[3]._4_4_ = in_stack_fffffffffffffee4;
    scale[0]._4_4_ = in_stack_fffffffffffffeec;
    scale[0]._0_4_ = in_stack_fffffffffffffee8;
    scale[1]._0_4_ = in_stack_fffffffffffffef0;
    scale[1]._4_4_ = in_stack_fffffffffffffef4;
    scale[2]._0_4_ = in_stack_fffffffffffffef8;
    scale[2]._4_4_ = in_stack_fffffffffffffefc;
    scale[3] = (longlong)ipoint;
    haarXY_unconditional_vectorized
              (iimage,row,col,scale,(float *)((long)haarResponseX + lVar23 + -0x60),
               (float *)((long)haarResponseY + lVar23 + -0x60));
    row_00[1]._0_4_ = fVar52;
    row_00[0] = in_stack_fffffffffffffea8;
    row_00[1]._4_4_ = fVar54;
    row_00[2]._0_4_ = uVar56;
    row_00[2]._4_4_ = uVar57;
    row_00[3] = lVar58;
    col_00._16_12_ = in_stack_fffffffffffffed8;
    col_00[0] = auVar37._0_8_;
    col_00[1] = auVar37._8_8_;
    col_00[3]._4_4_ = in_stack_fffffffffffffee4;
    scale_00[0]._4_4_ = in_stack_fffffffffffffeec;
    scale_00[0]._0_4_ = in_stack_fffffffffffffee8;
    scale_00[1]._0_4_ = in_stack_fffffffffffffef0;
    scale_00[1]._4_4_ = in_stack_fffffffffffffef4;
    scale_00[2]._0_4_ = in_stack_fffffffffffffef8;
    scale_00[2]._4_4_ = in_stack_fffffffffffffefc;
    scale_00[3] = (longlong)ipoint;
    haarXY_unconditional_vectorized
              (iimage,row_00,col_00,scale_00,(float *)((long)haarResponseX + lVar23),
               (float *)((long)haarResponseY + lVar23));
    row_01[1]._0_4_ = fVar52;
    row_01[0] = in_stack_fffffffffffffea8;
    row_01[1]._4_4_ = fVar54;
    row_01[2]._0_4_ = uVar56;
    row_01[2]._4_4_ = uVar57;
    row_01[3] = lVar58;
    col_01._16_12_ = in_stack_fffffffffffffed8;
    col_01[0] = auVar37._0_8_;
    col_01[1] = auVar37._8_8_;
    col_01[3]._4_4_ = in_stack_fffffffffffffee4;
    scale_01[0]._4_4_ = in_stack_fffffffffffffeec;
    scale_01[0]._0_4_ = in_stack_fffffffffffffee8;
    scale_01[1]._0_4_ = in_stack_fffffffffffffef0;
    scale_01[1]._4_4_ = in_stack_fffffffffffffef4;
    scale_01[2]._0_4_ = in_stack_fffffffffffffef8;
    scale_01[2]._4_4_ = in_stack_fffffffffffffefc;
    scale_01[3] = (longlong)ipoint;
    haarXY_unconditional_vectorized
              (iimage,row_01,col_01,scale_01,(float *)((long)haarResponseX + lVar23 + -0x40),
               (float *)((long)haarResponseY + lVar23 + -0x40));
    row_02[1]._0_4_ = fVar52;
    row_02[0] = in_stack_fffffffffffffea8;
    row_02[1]._4_4_ = fVar54;
    row_02[2]._0_4_ = uVar56;
    row_02[2]._4_4_ = uVar57;
    row_02[3] = lVar58;
    col_02._16_12_ = in_stack_fffffffffffffed8;
    col_02[0] = auVar37._0_8_;
    col_02[1] = auVar37._8_8_;
    col_02[3]._4_4_ = in_stack_fffffffffffffee4;
    scale_02[0]._4_4_ = in_stack_fffffffffffffeec;
    scale_02[0]._0_4_ = in_stack_fffffffffffffee8;
    scale_02[1]._0_4_ = in_stack_fffffffffffffef0;
    scale_02[1]._4_4_ = in_stack_fffffffffffffef4;
    scale_02[2]._0_4_ = in_stack_fffffffffffffef8;
    scale_02[2]._4_4_ = in_stack_fffffffffffffefc;
    scale_02[3] = (longlong)ipoint;
    haarXY_unconditional_vectorized
              (iimage,row_02,col_02,scale_02,(float *)((long)haarResponseX + lVar23 + 0x20),
               (float *)((long)haarResponseY + lVar23 + 0x20));
    row_03[1]._0_4_ = fVar52;
    row_03[0] = in_stack_fffffffffffffea8;
    row_03[1]._4_4_ = fVar54;
    row_03[2]._0_4_ = uVar56;
    row_03[2]._4_4_ = uVar57;
    row_03[3] = lVar58;
    col_03._16_12_ = in_stack_fffffffffffffed8;
    col_03[0] = auVar37._0_8_;
    col_03[1] = auVar37._8_8_;
    col_03[3]._4_4_ = in_stack_fffffffffffffee4;
    scale_03[0]._4_4_ = in_stack_fffffffffffffeec;
    scale_03[0]._0_4_ = in_stack_fffffffffffffee8;
    scale_03[1]._0_4_ = in_stack_fffffffffffffef0;
    scale_03[1]._4_4_ = in_stack_fffffffffffffef4;
    scale_03[2]._0_4_ = in_stack_fffffffffffffef8;
    scale_03[2]._4_4_ = in_stack_fffffffffffffefc;
    scale_03[3] = (longlong)ipoint;
    haarXY_unconditional_vectorized
              (iimage,row_03,col_03,scale_03,(float *)((long)haarResponseX + lVar23 + -0x20),
               (float *)((long)haarResponseY + lVar23 + -0x20));
    row_04[1]._0_4_ = fVar52;
    row_04[0] = in_stack_fffffffffffffea8;
    row_04[1]._4_4_ = fVar54;
    row_04[2]._0_4_ = uVar56;
    row_04[2]._4_4_ = uVar57;
    row_04[3] = lVar58;
    col_04._16_12_ = in_stack_fffffffffffffed8;
    col_04[0] = auVar37._0_8_;
    col_04[1] = auVar37._8_8_;
    col_04[3]._4_4_ = in_stack_fffffffffffffee4;
    scale_04[0]._4_4_ = in_stack_fffffffffffffeec;
    scale_04[0]._0_4_ = in_stack_fffffffffffffee8;
    scale_04[1]._0_4_ = in_stack_fffffffffffffef0;
    scale_04[1]._4_4_ = in_stack_fffffffffffffef4;
    scale_04[2]._0_4_ = in_stack_fffffffffffffef8;
    scale_04[2]._4_4_ = in_stack_fffffffffffffefc;
    scale_04[3] = (longlong)ipoint;
    haarXY_unconditional_vectorized
              (iimage,row_04,col_04,scale_04,(float *)((long)haarResponseX + lVar23 + 0x40),
               (float *)((long)haarResponseY + lVar23 + 0x40));
    lVar23 = lVar23 + 0x180;
  }
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  auVar50._8_4_ = 0x80000000;
  auVar50._0_8_ = 0x8000000080000000;
  auVar50._12_4_ = 0x80000000;
  fVar52 = -0.08 / fVar52;
  auVar28 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 0.5)),auVar50,0xf8);
  auVar28 = ZEXT416((uint)(fVar40 * 0.5 + auVar28._0_4_));
  auVar28 = vroundss_avx(auVar28,auVar28,0xb);
  auVar29 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 1.5)),auVar50,0xf8);
  auVar29 = ZEXT416((uint)(fVar40 * 1.5 + auVar29._0_4_));
  auVar29 = vroundss_avx(auVar29,auVar29,0xb);
  auVar30 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 2.5)),auVar50,0xf8);
  auVar30 = ZEXT416((uint)(fVar40 * 2.5 + auVar30._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar31 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 3.5)),auVar50,0xf8);
  auVar31 = ZEXT416((uint)(fVar40 * 3.5 + auVar31._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  auVar32 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 4.5)),auVar50,0xf8);
  auVar32 = ZEXT416((uint)(fVar40 * 4.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 5.5)),auVar50,0xf8);
  auVar33 = ZEXT416((uint)(fVar40 * 5.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 6.5)),auVar50,0xf8);
  auVar34 = ZEXT416((uint)(fVar40 * 6.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 7.5)),auVar50,0xf8);
  auVar35 = ZEXT416((uint)(auVar35._0_4_ + fVar40 * 7.5));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 8.5)),auVar50,0xf8);
  auVar36 = ZEXT416((uint)(fVar40 * 8.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 9.5)),auVar50,0xf8);
  auVar37 = ZEXT416((uint)(fVar40 * 9.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 10.5)),auVar50,0xf8);
  fVar44 = auVar30._0_4_;
  fVar3 = fVar44 + auVar29._0_4_;
  auVar30 = ZEXT416((uint)(fVar40 * 10.5 + auVar38._0_4_));
  auVar30 = vroundss_avx(auVar30,auVar30,0xb);
  auVar38 = vpternlogd_avx512vl(auVar51,ZEXT416((uint)(fVar40 * 11.5)),auVar50,0xf8);
  fVar54 = fVar44 + auVar28._0_4_;
  auVar38 = ZEXT416((uint)(fVar40 * 11.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  fVar40 = fVar44 - auVar28._0_4_;
  fVar59 = fVar44 - auVar29._0_4_;
  fVar60 = fVar44 - auVar31._0_4_;
  fVar61 = fVar44 - auVar32._0_4_;
  fVar62 = fVar44 - auVar33._0_4_;
  fVar44 = fVar44 - auVar34._0_4_;
  fVar49 = auVar35._0_4_;
  fVar53 = fVar49 - auVar31._0_4_;
  fVar55 = fVar49 - auVar32._0_4_;
  fVar4 = fVar49 - auVar33._0_4_;
  fVar5 = fVar49 - auVar34._0_4_;
  fVar6 = fVar49 - auVar36._0_4_;
  fVar7 = fVar49 - auVar37._0_4_;
  fVar8 = fVar49 - auVar30._0_4_;
  fVar49 = fVar49 - auVar38._0_4_;
  gauss_s1_c0[0] = expf(fVar52 * fVar3 * fVar3);
  gauss_s1_c0[1] = expf(fVar54 * fVar54 * fVar52);
  gauss_s1_c0[2] = expf(fVar40 * fVar40 * fVar52);
  gauss_s1_c0[3] = expf(fVar59 * fVar59 * fVar52);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar60 * fVar60 * fVar52);
  gauss_s1_c0[6] = expf(fVar61 * fVar61 * fVar52);
  gauss_s1_c0[7] = expf(fVar62 * fVar62 * fVar52);
  gauss_s1_c0[8] = expf(fVar44 * fVar44 * fVar52);
  gauss_s1_c1[0] = expf(fVar53 * fVar53 * fVar52);
  gauss_s1_c1[1] = expf(fVar55 * fVar55 * fVar52);
  gauss_s1_c1[2] = expf(fVar4 * fVar4 * fVar52);
  gauss_s1_c1[3] = expf(fVar5 * fVar5 * fVar52);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar6 * fVar6 * fVar52);
  gauss_s1_c1[6] = expf(fVar7 * fVar7 * fVar52);
  gauss_s1_c1[7] = expf(fVar8 * fVar8 * fVar52);
  gauss_s1_c1[8] = expf(fVar49 * fVar49 * fVar52);
  auVar43 = ZEXT1264(ZEXT812(0));
  iVar26 = 0;
  auVar28._8_4_ = 0x7fffffff;
  auVar28._0_8_ = 0x7fffffff7fffffff;
  auVar28._12_4_ = 0x7fffffff;
  lVar23 = 0;
  uVar20 = 0xfffffffffffffff8;
  pfVar11 = haarResponseY;
  pfVar16 = haarResponseX;
  while (uVar18 = (uint)uVar20, (int)uVar18 < 8) {
    pfVar25 = gauss_s1_c0;
    lVar24 = (long)iVar26;
    lVar23 = (long)(int)lVar23;
    if (uVar18 == 7) {
      pfVar25 = gauss_s1_c1;
    }
    if (uVar18 == 0xfffffff8) {
      pfVar25 = gauss_s1_c1;
    }
    uVar14 = 0;
    iVar26 = iVar26 + 4;
    uVar22 = 0xfffffffffffffff8;
    pfVar12 = pfVar11;
    pfVar17 = pfVar16;
    while (lVar24 != iVar26) {
      iVar10 = (int)uVar22;
      pfVar19 = gauss_s1_c0;
      auVar46 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar22 = (ulong)((uint)(uVar22 >> 0x1c) & 8);
      if (iVar10 == 7) {
        pfVar19 = gauss_s1_c1;
      }
      if (iVar10 == -8) {
        pfVar19 = gauss_s1_c1;
      }
      pfVar9 = pfVar17;
      pfVar13 = pfVar12;
      for (uVar15 = uVar14; uVar15 < iVar10 * 0x18 + 0x198; uVar15 = uVar15 + 0x18) {
        lVar21 = 0;
        pfVar27 = (float *)((long)pfVar25 + (ulong)(((uint)(uVar20 >> 0x1f) & 1) << 5));
        while (lVar21 != 9) {
          fVar40 = *pfVar27;
          pfVar27 = pfVar27 + (ulong)(~uVar18 >> 0x1f) * 2 + -1;
          pfVar1 = pfVar13 + lVar21;
          pfVar2 = pfVar9 + lVar21;
          lVar21 = lVar21 + 1;
          auVar31 = ZEXT416((uint)(pfVar19[uVar22] * fVar40 * *pfVar2));
          auVar29 = vandps_avx(auVar31,auVar28);
          auVar32 = ZEXT416((uint)(pfVar19[uVar22] * fVar40 * *pfVar1));
          auVar30 = vandps_avx(auVar32,auVar28);
          auVar31 = vinsertps_avx(auVar32,auVar31,0x10);
          auVar30 = vmovlhps_avx(auVar31,auVar30);
          auVar29 = vinsertps_avx(auVar30,auVar29,0x30);
          auVar46 = ZEXT1664(CONCAT412(auVar46._12_4_ + auVar29._12_4_,
                                       CONCAT48(auVar46._8_4_ + auVar29._8_4_,
                                                CONCAT44(auVar46._4_4_ + auVar29._4_4_,
                                                         auVar46._0_4_ + auVar29._0_4_))));
        }
        uVar22 = uVar22 + (ulong)(-1 < iVar10) * 2 + -1;
        pfVar9 = pfVar9 + 0x18;
        pfVar13 = pfVar13 + 0x18;
      }
      uVar22 = (ulong)(iVar10 + 5);
      uVar14 = uVar14 + 0x78;
      fVar40 = gauss_s2_arr[lVar24];
      auVar29._4_4_ = fVar40;
      auVar29._0_4_ = fVar40;
      auVar29._8_4_ = fVar40;
      auVar29._12_4_ = fVar40;
      auVar32 = vmulps_avx512vl(auVar46._0_16_,auVar29);
      lVar24 = lVar24 + 1;
      auVar37._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar37._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar37._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar37._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar30 = vshufpd_avx(auVar32,auVar32,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar23) = auVar32;
      lVar23 = lVar23 + 4;
      pfVar17 = pfVar17 + 0x78;
      pfVar12 = pfVar12 + 0x78;
      auVar29 = vmovshdup_avx(auVar37);
      auVar31 = vfmadd231ss_fma(auVar29,auVar32,auVar32);
      auVar29 = vshufps_avx(auVar32,auVar32,0xff);
      auVar30 = vfmadd213ss_fma(auVar30,auVar30,auVar31);
      auVar29 = vfmadd213ss_fma(auVar29,auVar29,auVar30);
      auVar43 = ZEXT464((uint)(auVar43._0_4_ + auVar29._0_4_));
    }
    pfVar16 = pfVar16 + 5;
    pfVar11 = pfVar11 + 5;
    uVar20 = (ulong)(uVar18 + 5);
  }
  if (auVar43._0_4_ < 0.0) {
    fVar40 = sqrtf(auVar43._0_4_);
  }
  else {
    auVar28 = vsqrtss_avx(auVar43._0_16_,auVar43._0_16_);
    fVar40 = auVar28._0_4_;
  }
  for (lVar23 = 0; lVar23 != 0x40; lVar23 = lVar23 + 1) {
    ipoint->descriptor[lVar23] = (1.0 / fVar40) * ipoint->descriptor[lVar23];
  }
  return;
}

Assistant:

void get_msurf_descriptor_simd_2_24_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
   
        __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
        __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
        __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

        __m256 ipoint_x_sub_int_scale_vec = _mm256_set1_ps((float) ipoint_x_sub_int_scale);

        // USE CVTTPS_EPI32 FOR TRUNCATION!!!
        __m256i sample_col1 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks1));
        __m256i sample_col0 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks0));
        __m256i sample_col2 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks2));

        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {

            int l_count1 = l_count + 1;

            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale + l * scale);
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale + (l+1) * scale);  

            __m256i sample_y_sub_int_scale_vec0 = _mm256_set1_epi32(sample_y_sub_int_scale0);
            __m256i sample_y_sub_int_scale_vec1 = _mm256_set1_epi32(sample_y_sub_int_scale1);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col0, int_scale_vec, &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col0, int_scale_vec, &haarResponseX[l_count1*24+0], &haarResponseY[l_count1*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col1, int_scale_vec, &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col1, int_scale_vec, &haarResponseX[l_count1*24+8], &haarResponseY[l_count1*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col2, int_scale_vec, &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col2, int_scale_vec, &haarResponseX[l_count1*24+16], &haarResponseY[l_count1*24+16]);
        }



    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}